

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Err.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_141ebf::DefaultErrStreamBuf::overflow(DefaultErrStreamBuf *this,int character)

{
  undefined1 *puVar1;
  int iVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  if (character == -1) {
    iVar2 = (**(code **)(*(long *)this + 0x30))(this);
    return iVar2;
  }
  puVar1 = *(undefined1 **)&this->field_0x28;
  if (puVar1 == *(undefined1 **)&this->field_0x30) {
    (**(code **)(*(long *)this + 0x30))(this);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x68);
  }
  else {
    if (puVar1 < *(undefined1 **)&this->field_0x30) {
      *puVar1 = (char)character;
      *(long *)&this->field_0x28 = *(long *)&this->field_0x28 + 1;
      return character & 0xff;
    }
    character = character & 0xff;
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x68);
  }
  iVar2 = (*UNRECOVERED_JUMPTABLE)(this,character);
  return iVar2;
}

Assistant:

virtual int overflow(int character)
    {
        if ((character != EOF) && (pptr() != epptr()))
        {
            // Valid character
            return sputc(static_cast<char>(character));
        }
        else if (character != EOF)
        {
            // Not enough space in the buffer: synchronize output and try again
            sync();
            return overflow(character);
        }
        else
        {
            // Invalid character: synchronize output
            return sync();
        }
    }